

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexSeparableKernel.h
# Opt level: O2

void __thiscall Ptex::v2_2::PtexSeparableKernel::stripZeros(PtexSeparableKernel *this)

{
  float *pfVar1;
  int iVar2;
  float *pfVar3;
  long lVar4;
  int iVar5;
  
  pfVar3 = this->ku;
  iVar5 = this->u;
  iVar2 = this->uw;
  lVar4 = (long)iVar2;
  pfVar1 = pfVar3;
  while( true ) {
    iVar5 = iVar5 + 1;
    iVar2 = iVar2 + -1;
    if ((*pfVar1 != 0.0) || (NAN(*pfVar1))) break;
    this->ku = pfVar1 + 1;
    this->u = iVar5;
    this->uw = iVar2;
    pfVar1 = pfVar1 + 1;
  }
  pfVar3 = pfVar3 + lVar4;
  while( true ) {
    pfVar3 = pfVar3 + -1;
    if ((*pfVar3 != 0.0) || (NAN(*pfVar3))) break;
    this->uw = iVar2;
    iVar2 = iVar2 + -1;
  }
  pfVar3 = this->kv;
  iVar5 = this->v;
  iVar2 = this->vw;
  lVar4 = (long)iVar2;
  pfVar1 = pfVar3;
  while( true ) {
    iVar5 = iVar5 + 1;
    iVar2 = iVar2 + -1;
    if ((*pfVar1 != 0.0) || (NAN(*pfVar1))) break;
    this->kv = pfVar1 + 1;
    this->v = iVar5;
    this->vw = iVar2;
    pfVar1 = pfVar1 + 1;
  }
  pfVar3 = pfVar3 + lVar4;
  while( true ) {
    pfVar3 = pfVar3 + -1;
    if ((*pfVar3 != 0.0) || (NAN(*pfVar3))) break;
    this->vw = iVar2;
    iVar2 = iVar2 + -1;
  }
  return;
}

Assistant:

void stripZeros()
    {
        while (ku[0] == 0) { ku++; u++; uw--; }
        while (ku[uw-1] == 0) { uw--; }
        while (kv[0] == 0) { kv++; v++; vw--; }
        while (kv[vw-1] == 0) { vw--; }
        assert(uw > 0 && vw > 0);
    }